

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newpfor.h
# Opt level: O3

uint32_t * __thiscall
FastPForLib::NewPFor<4U,_FastPForLib::Simple16<false>_>::decodeBlock
          (NewPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t *in,uint32_t *out,
          size_t *nvalue)

{
  pointer puVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  uint *puVar8;
  uint bit;
  pointer local_58;
  uint *local_50;
  ulong local_48;
  uint *local_40;
  size_t *local_38;
  
  uVar6 = *in;
  puVar8 = in + 1;
  uVar3 = uVar6 >> 0x10 & 0x3ff;
  bit = uVar6 >> 0x1a;
  uVar4 = (ulong)uVar6 & 0xffff;
  local_38 = nvalue;
  if (((uVar6 & 0xffff) != 0) &&
     (local_58 = (this->exceptions).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start, local_50 = puVar8, local_48 = uVar4,
     local_40 = puVar8, uVar3 != 0)) {
    puVar1 = local_58 + (ulong)uVar3 * 2;
    do {
      (**(code **)(Simple16<false>::unpackarray + (ulong)(*local_50 >> 0x1c) * 8))
                (&local_58,&local_50);
      uVar4 = local_48;
      puVar8 = local_40;
    } while (local_58 < puVar1);
  }
  puVar8 = puVar8 + uVar4;
  uVar6 = 0xffffffe0;
  lVar5 = 0;
  do {
    fastunpack(puVar8,(uint32_t *)((long)out + lVar5),bit);
    uVar6 = uVar6 + 0x20;
    puVar8 = (uint *)((long)puVar8 + (ulong)(bit * 4));
    lVar5 = lVar5 + 0x80;
  } while (uVar6 < 0x60);
  if (uVar3 != 0) {
    uVar4 = 0xffffffff;
    uVar7 = 0;
    puVar1 = (this->exceptions).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      uVar4 = (ulong)(uint)((int)uVar4 + 1 + *(int *)((long)puVar1 + uVar7));
      lVar2 = uVar7 + uVar3 * 4;
      uVar7 = uVar7 + 4;
      out[uVar4] = out[uVar4] | *(int *)((long)puVar1 + lVar2) + 1 << (bit & 0x1f);
    } while (uVar3 * 4 != uVar7);
  }
  *local_38 = lVar5 >> 2;
  return puVar8;
}

Assistant:

const uint32_t *
NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::decodeBlock(
    const uint32_t *in, uint32_t *out, size_t &nvalue) {
  const uint32_t *const initout(out);
  const uint32_t b = *in >> (32 - PFORDELTA_B);
  const size_t nExceptions = (*in >> (32 - (PFORDELTA_B + PFORDELTA_NEXCEPT))) &
                             ((1 << PFORDELTA_NEXCEPT) - 1);
  const uint32_t encodedExceptionsSize = *in & ((1 << PFORDELTA_EXCEPTSZ) - 1);

  size_t twonexceptions = 2 * nExceptions;
  ++in;
  if (encodedExceptionsSize > 0)
    ecoder.decodeArray(in, encodedExceptionsSize, &exceptions[0],
                       twonexceptions);
  assert(twonexceptions >= 2 * nExceptions);
  in += encodedExceptionsSize;

  uint32_t *beginout(out); // we use this later

  for (uint32_t j = 0; j < BlockSize; j += 32) {
    fastunpack(in, out, b);
    in += b;
    out += 32;
  }

  for (uint32_t e = 0, lpos = -1; e < nExceptions; e++) {
    lpos += exceptions[e] + 1;
    beginout[lpos] |= (exceptions[e + nExceptions] + 1) << b;
  }

  nvalue = out - initout;
  return in;
}